

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

string * __thiscall
t_st_generator::struct_reader
          (string *__return_storage_ptr__,t_st_generator *this,t_struct *tstruct,string *clsName)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  members_type *this_00;
  long lVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  reference pptVar6;
  string *psVar7;
  t_type *t;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_360
  ;
  t_field **local_358;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  byte local_2c9;
  string local_2c8;
  byte local_2a1;
  string local_2a0;
  string local_280;
  string local_260;
  undefined1 local_240 [8];
  string name;
  string found;
  string desc;
  string val;
  const_iterator fld_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  ostringstream out;
  string *clsName_local;
  t_struct *tstruct_local;
  t_st_generator *this_local;
  
  out._368_8_ = clsName;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fields);
  this_00 = t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     *)((long)&val.field_2 + 8));
  temp_name_abi_cxx11_((string *)((long)&desc.field_2 + 8),this);
  temp_name_abi_cxx11_((string *)((long)&found.field_2 + 8),this);
  temp_name_abi_cxx11_((string *)((long)&name.field_2 + 8),this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 == 0) {
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::__cxx11::string::operator=((string *)clsName,(string *)CONCAT44(extraout_var,iVar2));
  }
  poVar5 = std::operator<<((ostream *)&fields,"[|");
  poVar5 = std::operator<<(poVar5,(string *)(found.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = std::operator<<(poVar5,(string *)(desc.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"|");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  local_2a1 = 0;
  local_2c9 = 0;
  std::__cxx11::string::string((string *)&local_280,(string *)clsName);
  t_generator::capitalize(&local_260,(t_generator *)this,&local_280);
  bVar1 = std::operator==(&local_260,"TResult");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_2a0,(string *)clsName);
    local_2a1 = 1;
    t_generator::capitalize((string *)local_240,(t_generator *)this,&local_2a0);
  }
  else {
    std::__cxx11::string::string((string *)&local_2c8,(string *)clsName);
    local_2c9 = 1;
    prefix((string *)local_240,this,&local_2c8);
  }
  if ((local_2c9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2c8);
  }
  if ((local_2a1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  t_generator::indent_abi_cxx11_(&local_2f0,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)&fields,(string *)&local_2f0);
  poVar5 = std::operator<<(poVar5,(string *)(desc.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5," := ");
  poVar5 = std::operator<<(poVar5,(string *)local_240);
  poVar5 = std::operator<<(poVar5," new.");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2f0);
  t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)&fields,(string *)&local_310);
  poVar5 = std::operator<<(poVar5,"iprot readStructBegin.");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_330);
  poVar5 = std::operator<<(poVar5,"[");
  poVar5 = std::operator<<(poVar5,(string *)(found.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5," := iprot readFieldBegin.");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_350,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_350);
  poVar5 = std::operator<<(poVar5,(string *)(found.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5," type = TType stop] whileFalse: [|");
  poVar5 = std::operator<<(poVar5,(string *)(name.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"|");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  t_generator::indent_up((t_generator *)this);
  local_358 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  val.field_2._8_8_ = local_358;
  while( true ) {
    local_360._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&val.field_2 + 8),&local_360);
    if (!bVar1) break;
    t_generator::indent_abi_cxx11_(&local_380,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)&fields,(string *)&local_380);
    poVar5 = std::operator<<(poVar5,(string *)(found.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5," id = ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&val.field_2 + 8));
    iVar3 = t_field::get_key(*pptVar6);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    poVar5 = std::operator<<(poVar5," ifTrue: [");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_380);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_3a0,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)&fields,(string *)&local_3a0);
    poVar5 = std::operator<<(poVar5,(string *)(name.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5," := true.");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_3c0,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_3c0);
    poVar5 = std::operator<<(poVar5,(string *)(desc.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5," ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&val.field_2 + 8));
    psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
    std::__cxx11::string::string((string *)&local_400,(string *)psVar7);
    t_generator::camelcase(&local_3e0,(t_generator *)this,&local_400);
    poVar5 = std::operator<<(poVar5,(string *)&local_3e0);
    poVar5 = std::operator<<(poVar5,": ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&val.field_2 + 8));
    t = t_field::get_type(*pptVar6);
    read_val_abi_cxx11_(&local_420,this,t);
    std::operator<<(poVar5,(string *)&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3a0);
    t_generator::indent_down((t_generator *)this);
    poVar5 = std::operator<<((ostream *)&fields,"].");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                *)((long)&val.field_2 + 8));
  }
  t_generator::indent_abi_cxx11_(&local_440,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)&fields,(string *)&local_440);
  poVar5 = std::operator<<(poVar5,(string *)(name.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5," ifNil: [iprot skip: ");
  poVar5 = std::operator<<(poVar5,(string *)(found.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5," type]].");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_440);
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_460,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)&fields,(string *)&local_460);
  poVar5 = std::operator<<(poVar5,"oprot readStructEnd.");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_480,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_480);
  poVar5 = std::operator<<(poVar5,(string *)(desc.field_2._M_local_buf + 8));
  std::operator<<(poVar5,"] value");
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::~string((string *)&local_460);
  t_generator::indent_down((t_generator *)this);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string((string *)local_240);
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(found.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fields);
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::struct_reader(t_struct* tstruct, string clsName = "") {
  std::ostringstream out;
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator fld_iter;
  string val = temp_name();
  string desc = temp_name();
  string found = temp_name();

  if (clsName.size() == 0) {
    clsName = tstruct->get_name();
  }

  out << "[|" << desc << " " << val << "|" << endl;
  indent_up();

  // This is nasty, but without it we'll break things by prefixing TResult.
  string name = ((capitalize(clsName) == "TResult") ? capitalize(clsName) : prefix(clsName));
  out << indent() << val << " := " << name << " new." << endl;

  out << indent() << "iprot readStructBegin." << endl << indent() << "[" << desc
      << " := iprot readFieldBegin." << endl << indent() << desc
      << " type = TType stop] whileFalse: [|" << found << "|" << endl;
  indent_up();

  for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
    out << indent() << desc << " id = " << (*fld_iter)->get_key() << " ifTrue: [" << endl;
    indent_up();

    out << indent() << found << " := true." << endl << indent() << val << " "
        << camelcase((*fld_iter)->get_name()) << ": " << read_val((*fld_iter)->get_type());
    indent_down();

    out << "]." << endl;
  }

  out << indent() << found << " ifNil: [iprot skip: " << desc << " type]]." << endl;
  indent_down();

  out << indent() << "oprot readStructEnd." << endl << indent() << val << "] value";
  indent_down();

  return out.str();
}